

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GRouter.cpp
# Opt level: O1

int CGRouter::FilterRouting(CDesign *pDesign,CWire *pWire)

{
  CNet *pCVar1;
  int iVar2;
  int iVar3;
  
  if (pWire != (CWire *)0x0) {
    iVar2 = CWire::IsCompleted(pWire);
    iVar3 = 1;
    if ((iVar2 == 0) && (pCVar1 = (CNet *)(pWire->super_CObject).m_pParent, pCVar1 != (CNet *)0x0))
    {
      CNet::SplitWire(pCVar1);
      pCVar1 = (CNet *)(pWire->super_CObject).m_pParent;
      if (pCVar1 != (CNet *)0x0) {
        iVar2 = CWire::IsCompleted(pWire);
        if (iVar2 == 0) {
          iVar2 = CNet::IsConnected(pCVar1,pWire->m_pPointS,pWire->m_pPointE);
          if (iVar2 == 0) {
            iVar3 = 0;
          }
          else {
            CNet::DelWire(pCVar1,pWire,0);
            CNet::Refine(pCVar1);
            CWire::Delete(pWire);
          }
        }
      }
    }
    return iVar3;
  }
  __assert_fail("pWire",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                ,0x6cd,"static int CGRouter::FilterRouting(CDesign *, CWire *)");
}

Assistant:

int CGRouter::FilterRouting(CDesign* pDesign, CWire* pWire)
{
	assert(pWire);
	
	if(pWire->IsCompleted())	
	{
		return	TRUE;
	}
	
	CNet*	pNet	=	pWire->GetParent();
	// it is deleted from the net [7/1/2006 thyeros]
	if(pNet==NULL)	return	TRUE;

	pNet->SplitWire();
	pNet	=	pWire->GetParent();
	
	// it is deleted from the net [7/1/2006 thyeros]
	if(pNet==NULL)	return	TRUE;
	if(pWire->IsCompleted())		return	TRUE;
	
	if(pNet->IsConnected(pWire->m_pPointS,pWire->m_pPointE))
	{
		pNet->DelWire(pWire);
		pNet->Refine();

		pWire->Delete();//SAFE_DEL(pWire);

		return	TRUE;
	}

	return	FALSE;
}